

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

int __thiscall CAPSFile::WriteToBuffer(CAPSFile *this,uchar *buffer,uint size_of_buffer)

{
  uchar *__src;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pointer paVar4;
  reference __src_00;
  pointer paVar5;
  long lVar6;
  reference paVar7;
  uint crc_1;
  int lg_1;
  int base_offset_1;
  __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
  local_58;
  iterator it_1;
  uint crc;
  int lg;
  int base_offset;
  __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
  local_38;
  iterator it;
  int local_28;
  int size;
  int offset;
  uint size_of_buffer_local;
  uchar *buffer_local;
  CAPSFile *this_local;
  
  uVar2 = (*this->_vptr_CAPSFile[5])();
  if (size_of_buffer < uVar2) {
    this_local._4_4_ = -1;
  }
  else {
    it._M_current._4_4_ = SwapInt((this->caps_header_).length);
    memcpy(buffer,&this->caps_header_,(long)(int)it._M_current._4_4_);
    uVar2 = it._M_current._4_4_;
    it._M_current._4_4_ = SwapInt((this->caps_info_).header.length);
    memcpy(buffer + (int)uVar2,&this->caps_info_,(long)(int)it._M_current._4_4_);
    local_28 = it._M_current._4_4_ + uVar2;
    local_38._M_current =
         (anon_struct_80_16_0595f1fa *)
         std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::begin
                   (&this->list_imge_);
    while( true ) {
      _lg = std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::end
                      (&this->list_imge_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
                          *)&lg);
      if (!bVar1) break;
      paVar4 = __gnu_cxx::
               __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
               ::operator->(&local_38);
      (paVar4->header).crc = 0;
      paVar4 = __gnu_cxx::
               __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
               ::operator->(&local_38);
      uVar2 = (paVar4->header).length;
      __src_00 = __gnu_cxx::
                 __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
                 ::operator*(&local_38);
      memcpy(buffer + local_28,__src_00,(long)(int)uVar2);
      Swap(buffer + (local_28 + 4),uVar2 - 4);
      uVar3 = CRC::ComputeCrc32(0xedb88320,buffer + local_28,uVar2);
      it_1._M_current._4_4_ = SwapInt(uVar3);
      *(uint *)(buffer + (local_28 + 8)) = it_1._M_current._4_4_;
      local_28 = uVar2 + local_28;
      __gnu_cxx::
      __normal_iterator<CAPSFile::ImgeItem_*,_std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>_>
      ::operator++(&local_38);
    }
    local_58._M_current =
         (anon_struct_36_6_d3f54bdf *)
         std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>::begin
                   (&this->list_data_);
    while( true ) {
      _lg_1 = std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>::end
                        (&this->list_data_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_58,
                         (__normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                          *)&lg_1);
      if (!bVar1) break;
      paVar5 = __gnu_cxx::
               __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
               ::operator->(&local_58);
      if (3 < (paVar5->header).length) {
        paVar5 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator->(&local_58);
        (paVar5->header).crc = 0;
        paVar5 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator->(&local_58);
        uVar2 = (paVar5->header).length;
        lVar6 = (long)local_28;
        paVar7 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator*(&local_58);
        *(undefined8 *)(buffer + lVar6) = *(undefined8 *)&paVar7->header;
        *(undefined8 *)(buffer + lVar6 + 8) = *(undefined8 *)&(paVar7->header).crc;
        *(undefined8 *)(buffer + lVar6 + 0x10) = *(undefined8 *)&paVar7->bit_size;
        *(uint *)(buffer + lVar6 + 0x18) = paVar7->data_id;
        Swap(buffer + (local_28 + 4),0x18);
        paVar5 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator->(&local_58);
        __src = paVar5->buffer;
        paVar5 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator->(&local_58);
        memcpy(buffer + (local_28 + 0x1c),__src,(ulong)paVar5->size);
        paVar5 = __gnu_cxx::
                 __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
                 ::operator->(&local_58);
        uVar3 = paVar5->size;
        uVar2 = CRC::ComputeCrc32(0xedb88320,buffer + local_28,uVar2);
        uVar2 = SwapInt(uVar2);
        *(uint *)(buffer + (local_28 + 8)) = uVar2;
        local_28 = uVar3 + local_28 + 0x1c;
      }
      paVar5 = __gnu_cxx::
               __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
               ::operator->(&local_58);
      if (paVar5->buffer != (uchar *)0x0) {
        operator_delete__(paVar5->buffer);
      }
      paVar5 = __gnu_cxx::
               __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
               ::operator->(&local_58);
      paVar5->buffer = (uchar *)0x0;
      __gnu_cxx::
      __normal_iterator<CAPSFile::DataChunks_*,_std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>_>
      ::operator++(&local_58);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CAPSFile::WriteToBuffer(unsigned char* buffer, unsigned int size_of_buffer)
{
   // Write header
   int offset = 0;

   if (size_of_buffer < ComputeSize())
      return -1;

   int size = SwapInt(caps_header_.length);
   memcpy(&buffer[offset], &caps_header_, size);
   offset += size;

   // Write INFO
   size = SwapInt(caps_info_.header.length);
   memcpy(&buffer[offset], &caps_info_, size);
   offset += size;

   // Write IMGE
   for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end(); ++it)
   {
      int base_offset = offset;
      it->header.crc = 0;
      int lg = it->header.length;
      memcpy(&buffer[offset], &(*it), lg);
      Swap(&buffer[offset + 4], lg - 4);
      unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
      memcpy(&buffer[offset + 8], &crc, 4);
      offset += lg;
   }

   // Write DATA
   for (std::vector<DataChunks>::iterator it = list_data_.begin(); it != list_data_.end(); ++it)
   {
      if (it->header.length >= 4)
      {
         // datablock
         int base_offset = offset;
         it->header.crc = 0;
         int lg = it->header.length;

         memcpy(&buffer[offset], &(*it), sizeof(DataChunks) - sizeof(unsigned char*));
         Swap(&buffer[offset + 4], sizeof(DataChunks) - (4+ sizeof(unsigned char*)));
         offset += sizeof(DataChunks) - sizeof(unsigned char*);

         memcpy(&buffer[offset], it->buffer, it->size);
         offset += it->size;

         unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
         memcpy(&buffer[base_offset + 8], &crc, 4);
      }
      delete[]it->buffer;
      it->buffer = NULL;
   }

   return 0;
}